

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *this)

{
  BrandedDecl *firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::BrandedDecl> *pRVar1;
  BrandedDecl *pBVar2;
  BrandedDecl *endCopy;
  BrandedDecl *posCopy;
  BrandedDecl *ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pBVar2 = this->endPtr;
  if (firstElement != (BrandedDecl *)0x0) {
    this->ptr = (BrandedDecl *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandedDecl> *)0x0;
    this->endPtr = (BrandedDecl *)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::BrandedDecl>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0xa8,
               ((long)pBVar2 - (long)firstElement) / 0xa8);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }